

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<long>(numtostr *this,long x)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (x == 0) {
    (this->m_buf)._M_elems[0] = '0';
  }
  else {
    lVar4 = x;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (uVar7 == 0x3f) {
        __assert_fail("x == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x2066,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
                     );
      }
      lVar9 = lVar4 % 10;
      lVar2 = -lVar9;
      if (0 < lVar9) {
        lVar2 = lVar9;
      }
      (this->m_buf)._M_elems[uVar7] = (char)lVar2 + '0';
      uVar8 = uVar7 + 1;
      uVar5 = lVar4 + 9;
      lVar4 = lVar4 / 10;
    } while (0x12 < uVar5);
    if (x < 0) {
      if (0x3c < uVar7) {
        __assert_fail("i < m_buf.size() - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x206b,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::true_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = long]"
                     );
      }
      (this->m_buf)._M_elems[uVar8] = '-';
      uVar8 = uVar7 + 2;
    }
    pcVar3 = (this->m_buf)._M_elems + (uVar8 - 1);
    if (this < pcVar3) {
      pcVar6 = (this->m_buf)._M_elems;
      do {
        pcVar6 = pcVar6 + 1;
        cVar1 = ((array<char,_64UL> *)(pcVar6 + -1))->_M_elems[0];
        ((array<char,_64UL> *)(pcVar6 + -1))->_M_elems[0] = *pcVar3;
        *pcVar3 = cVar1;
        pcVar3 = pcVar3 + -1;
      } while (pcVar6 < pcVar3);
    }
  }
  return;
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::true_type)
        {
            // special case for "0"
            if (x == 0)
            {
                m_buf[0] = '0';
                return;
            }

            const bool is_negative = x < 0;
            size_t i = 0;

            // spare 1 byte for '\0'
            while (x != 0 and i < m_buf.size() - 1)
            {
                const auto digit = std::labs(static_cast<long>(x % 10));
                m_buf[i++] = static_cast<char>('0' + digit);
                x /= 10;
            }

            // make sure the number has been processed completely
            assert(x == 0);

            if (is_negative)
            {
                // make sure there is capacity for the '-'
                assert(i < m_buf.size() - 2);
                m_buf[i++] = '-';
            }

            std::reverse(m_buf.begin(), m_buf.begin() + i);
        }